

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall GlobOpt::IsWorthSpecializingToInt32DueToDst(GlobOpt *this,Opnd *dst)

{
  StackSym *sym_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *pRVar4;
  GlobOptBlockData *this_00;
  bool local_2a;
  bool local_29;
  StackSym *sym;
  Opnd *dst_local;
  GlobOpt *this_local;
  
  if (dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1d3b,"(dst)","dst");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pRVar4 = IR::Opnd::AsRegOpnd(dst);
  sym_00 = pRVar4->m_sym;
  this_00 = CurrentBlockData(this);
  bVar2 = GlobOptBlockData::IsInt32TypeSpecialized(this_00,&sym_00->super_Sym);
  local_29 = true;
  if (!bVar2) {
    local_2a = false;
    if (this->currentBlock->loop != (Loop *)0x0) {
      local_2a = GlobOptBlockData::IsLive
                           (&this->currentBlock->loop->landingPad->globOptData,&sym_00->super_Sym);
    }
    local_29 = local_2a;
  }
  return local_29;
}

Assistant:

bool
GlobOpt::IsWorthSpecializingToInt32DueToDst(IR::Opnd *const dst)
{
    Assert(dst);

    const auto sym = dst->AsRegOpnd()->m_sym;
    return
        CurrentBlockData()->IsInt32TypeSpecialized(sym) ||
        (this->currentBlock->loop && this->currentBlock->loop->landingPad->globOptData.IsLive(sym));
}